

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall crsGA::Logger::stopProcessingMessages(Logger *this)

{
  ThreadSafeQueue<crsGA::Logger::LogMessage> *this_00;
  bool bVar1;
  LogMessage logMessage;
  undefined1 auStack_68 [32];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  LOCK();
  (this->_exit)._M_base._M_i = true;
  UNLOCK();
  this_00 = &this->_queue;
  ThreadSafeQueue<crsGA::Logger::LogMessage>::notify_and_terminate(this_00);
  if ((this->_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  while( true ) {
    bVar1 = ThreadSafeQueue<crsGA::Logger::LogMessage>::empty(this_00);
    if (bVar1) break;
    auStack_68._8_8_ = 0;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_48._M_p = (pointer)&local_38;
    bVar1 = ThreadSafeQueue<crsGA::Logger::LogMessage>::pop(this_00,(LogMessage *)auStack_68);
    if (bVar1) {
      dispatchLogMessage(this,(LogMessage *)auStack_68);
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void Logger::stopProcessingMessages()
{
    _exit = true;
    _queue.notify_and_terminate();
    if (_thread.joinable())
        _thread.join();
    // purge messages
    while (!_queue.empty())
    {
        LogMessage logMessage;
        if (_queue.pop(logMessage))
        {
            dispatchLogMessage(logMessage);
        }
    }
}